

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLProgram.cpp
# Opt level: O2

void __thiscall Diligent::GLProgram::~GLProgram(GLProgram *this)

{
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->m_pResources).
              super___shared_ptr<const_Diligent::ShaderResourcesGL,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&this->m_InfoLog);
  std::_Vector_base<const_Diligent::ShaderGLImpl_*,_std::allocator<const_Diligent::ShaderGLImpl_*>_>
  ::~_Vector_base(&(this->m_AttachedShaders).
                   super__Vector_base<const_Diligent::ShaderGLImpl_*,_std::allocator<const_Diligent::ShaderGLImpl_*>_>
                 );
  GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLProgramObjCreateReleaseHelper>::~GLObjWrapper
            (&this->m_GLProg);
  return;
}

Assistant:

GLProgram::~GLProgram()
{
}